

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O1

GLFWglproc getProcAddressEGL(char *procname)

{
  void *pvVar1;
  _GLFWwindow *p_Var2;
  GLFWglproc p_Var3;
  
  p_Var2 = _glfwPlatformGetCurrentContext();
  pvVar1 = (p_Var2->context).egl.client;
  if (pvVar1 != (void *)0x0) {
    p_Var3 = (GLFWglproc)dlsym(pvVar1,procname);
    if (p_Var3 != (GLFWglproc)0x0) {
      return p_Var3;
    }
  }
  p_Var3 = (*_glfw.egl.GetProcAddress)(procname);
  return p_Var3;
}

Assistant:

static GLFWglproc getProcAddressEGL(const char* procname)
{
    _GLFWwindow* window = _glfwPlatformGetCurrentContext();

    if (window->context.egl.client)
    {
        GLFWglproc proc = (GLFWglproc) _glfw_dlsym(window->context.egl.client,
                                                   procname);
        if (proc)
            return proc;
    }

    return eglGetProcAddress(procname);
}